

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chaiscript_parser.hpp
# Opt level: O3

void chaiscript::parser::ChaiScript_Parser::optimize_returns(AST_NodePtr *p)

{
  element_type *peVar1;
  AST_NodePtr *pAVar2;
  pointer psVar3;
  undefined8 *puVar4;
  shared_ptr<chaiscript::AST_Node> *c;
  AST_NodePtr *p_00;
  
  peVar1 = (p->super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  pAVar2 = (peVar1->children).
           super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (p_00 = (peVar1->children).
              super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
              ._M_impl.super__Vector_impl_data._M_start; p_00 != pAVar2; p_00 = p_00 + 1) {
    peVar1 = (p_00->super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
    if (((peVar1->identifier == 0x18) &&
        (psVar3 = (peVar1->children).
                  super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_finish,
        psVar3 != (peVar1->children).
                  super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                  ._M_impl.super__Vector_impl_data._M_start)) &&
       (peVar1 = psVar3[-1].super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>.
                 _M_ptr, peVar1->identifier == 0x17)) {
      psVar3 = *(pointer *)
                ((long)&(peVar1->children).
                        super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
                        ._M_impl + 8);
      peVar1 = psVar3[-1].super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>.
               _M_ptr;
      if ((peVar1->identifier == 0x1e) &&
         (puVar4 = *(undefined8 **)
                    &(peVar1->children).
                     super__Vector_base<std::shared_ptr<chaiscript::AST_Node>,_std::allocator<std::shared_ptr<chaiscript::AST_Node>_>_>
         , (long)*(pointer *)((long)&peVar1->children + 8) - (long)puVar4 == 0x10)) {
        psVar3[-1].super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>._M_ptr =
             (element_type *)*puVar4;
        std::__shared_count<(__gnu_cxx::_Lock_policy)2>::operator=
                  (&psVar3[-1].super___shared_ptr<chaiscript::AST_Node,_(__gnu_cxx::_Lock_policy)2>.
                    _M_refcount,(__shared_count<(__gnu_cxx::_Lock_policy)2> *)(puVar4 + 1));
      }
    }
    optimize_returns(p_00);
  }
  return;
}

Assistant:

bool Symbol(const char *t_s, const bool t_capture = false, const bool t_disallow_prevention=false) {
        SkipWS();
        const auto start = m_position;
        bool retval = Symbol_(t_s);

        // ignore substring matches
        if (retval && m_position.has_more() && (t_disallow_prevention == false) && char_in_alphabet(*m_position,detail::symbol_alphabet)) {
          if (*m_position != '=' && is_operator(Position::str(start, m_position)) && !is_operator(Position::str(start, m_position+1))) {
            // don't throw this away, it's a good match and the next is not
          } else {
            m_position = start;
            retval = false;
          }
        }

        if ( t_capture && retval ) {
          m_match_stack.push_back(make_node<eval::Str_AST_Node>(Position::str(start, m_position), start.line, start.col));
        }

        return retval;
      }